

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::UOConfig::endUnderlayOverlay(UOConfig *this)

{
  Config *pCVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pCVar1 = this->config;
  peVar2 = (pCVar1->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2->under_overlay->filename)._M_string_length == 0) {
    std::operator+(&local_30,&peVar2->under_overlay->which," file not specified");
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar1 = this->config;
    peVar2 = (pCVar1->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar2->under_overlay = (UnderOverlay *)0x0;
  return pCVar1;
}

Assistant:

QPDFJob::Config*
QPDFJob::UOConfig::endUnderlayOverlay()
{
    if (config->o.m->under_overlay->filename.empty()) {
        usage(config->o.m->under_overlay->which + " file not specified");
    }
    config->o.m->under_overlay = nullptr;
    return this->config;
}